

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O0

void llvm::APInt::divide(WordType *LHS,uint lhsWords,WordType *RHS,uint rhsWords,WordType *Quotient,
                        WordType *Remainder)

{
  uint uVar1;
  undefined1 auVar2 [16];
  int iVar3;
  uint32_t uVar4;
  ulong uVar5;
  uint64_t uVar6;
  bool bVar7;
  uint local_2b0;
  uint local_2ac;
  uint i_6;
  uint i_5;
  uint64_t partial_dividend;
  uint32_t local_298;
  int i_4;
  uint32_t remainder;
  uint32_t divisor;
  uint i_3;
  uint i_2;
  uint64_t tmp_1;
  uint i_1;
  uint64_t tmp;
  uint32_t *puStack_268;
  uint i;
  uint32_t *R;
  uint32_t *Q;
  uint32_t *V;
  uint32_t *U;
  uint32_t SPACE [128];
  uint local_40;
  uint local_3c;
  uint m;
  uint n;
  WordType *Remainder_local;
  WordType *Quotient_local;
  uint rhsWords_local;
  WordType *RHS_local;
  uint lhsWords_local;
  WordType *LHS_local;
  
  if (lhsWords < rhsWords) {
    __assert_fail("lhsWords >= rhsWords && \"Fractional result\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                  ,0x581,
                  "static void llvm::APInt::divide(const WordType *, unsigned int, const WordType *, unsigned int, WordType *, WordType *)"
                 );
  }
  divisor = rhsWords * 2;
  local_40 = lhsWords * 2 + rhsWords * -2;
  puStack_268 = (uint32_t *)0x0;
  iVar3 = 3;
  if (Remainder != (WordType *)0x0) {
    iVar3 = 4;
  }
  if (iVar3 * divisor + local_40 * 2 + 1 < 0x81) {
    V = (uint32_t *)&U;
    Q = SPACE + ((ulong)(local_40 + divisor + 1) - 2);
    R = SPACE + ((ulong)(local_40 + rhsWords * 4 + 1) - 2);
    if (Remainder != (WordType *)0x0) {
      puStack_268 = SPACE + ((ulong)(local_40 * 2 + rhsWords * 6 + 1) - 2);
    }
  }
  else {
    auVar2 = ZEXT416(local_40 + divisor + 1) * ZEXT816(4);
    uVar5 = auVar2._0_8_;
    if (auVar2._8_8_ != 0) {
      uVar5 = 0xffffffffffffffff;
    }
    V = (uint32_t *)operator_new__(uVar5);
    uVar5 = SUB168(ZEXT416(divisor) * ZEXT816(4),0);
    if (SUB168(ZEXT416(divisor) * ZEXT816(4),8) != 0) {
      uVar5 = 0xffffffffffffffff;
    }
    Q = (uint32_t *)operator_new__(uVar5);
    auVar2 = ZEXT416(local_40 + divisor) * ZEXT816(4);
    uVar5 = auVar2._0_8_;
    if (auVar2._8_8_ != 0) {
      uVar5 = 0xffffffffffffffff;
    }
    R = (uint32_t *)operator_new__(uVar5);
    if (Remainder != (WordType *)0x0) {
      uVar5 = SUB168(ZEXT416(divisor) * ZEXT816(4),0);
      if (SUB168(ZEXT416(divisor) * ZEXT816(4),8) != 0) {
        uVar5 = 0xffffffffffffffff;
      }
      puStack_268 = (uint32_t *)operator_new__(uVar5);
    }
  }
  memset(V,0,(ulong)(local_40 + divisor + 1) << 2);
  for (tmp._4_4_ = 0; tmp._4_4_ < lhsWords; tmp._4_4_ = tmp._4_4_ + 1) {
    uVar6 = LHS[tmp._4_4_];
    uVar4 = Lo_32(uVar6);
    V[tmp._4_4_ << 1] = uVar4;
    uVar4 = Hi_32(uVar6);
    V[tmp._4_4_ * 2 + 1] = uVar4;
  }
  V[local_40 + divisor] = 0;
  memset(Q,0,(ulong)divisor << 2);
  for (tmp_1._4_4_ = 0; tmp_1._4_4_ < rhsWords; tmp_1._4_4_ = tmp_1._4_4_ + 1) {
    uVar6 = RHS[tmp_1._4_4_];
    uVar4 = Lo_32(uVar6);
    Q[tmp_1._4_4_ << 1] = uVar4;
    uVar4 = Hi_32(uVar6);
    Q[tmp_1._4_4_ * 2 + 1] = uVar4;
  }
  memset(R,0,(ulong)(local_40 + divisor) << 2);
  local_3c = divisor;
  if (Remainder != (WordType *)0x0) {
    memset(puStack_268,0,(ulong)divisor << 2);
  }
  while( true ) {
    bVar7 = false;
    if (divisor != 0) {
      bVar7 = Q[divisor - 1] == 0;
    }
    if (!bVar7) break;
    local_3c = local_3c - 1;
    local_40 = local_40 + 1;
    divisor = divisor - 1;
  }
  remainder = local_40 + local_3c;
  while( true ) {
    bVar7 = false;
    if (remainder != 0) {
      bVar7 = V[remainder - 1] == 0;
    }
    if (!bVar7) break;
    local_40 = local_40 - 1;
    remainder = remainder - 1;
  }
  if (local_3c != 0) {
    if (local_3c == 1) {
      uVar1 = *Q;
      local_298 = 0;
      for (partial_dividend._4_4_ = local_40; -1 < (int)partial_dividend._4_4_;
          partial_dividend._4_4_ = partial_dividend._4_4_ - 1) {
        uVar6 = Make_64(local_298,V[(int)partial_dividend._4_4_]);
        if (uVar6 == 0) {
          R[(int)partial_dividend._4_4_] = 0;
          local_298 = 0;
        }
        else if (uVar6 < uVar1) {
          R[(int)partial_dividend._4_4_] = 0;
          local_298 = Lo_32(uVar6);
        }
        else if (uVar6 == uVar1) {
          R[(int)partial_dividend._4_4_] = 1;
          local_298 = 0;
        }
        else {
          uVar4 = Lo_32(uVar6 / uVar1);
          R[(int)partial_dividend._4_4_] = uVar4;
          local_298 = Lo_32(uVar6 - R[(int)partial_dividend._4_4_] * uVar1);
        }
      }
      if (puStack_268 != (uint32_t *)0x0) {
        *puStack_268 = local_298;
      }
    }
    else {
      KnuthDiv(V,Q,R,puStack_268,local_40,local_3c);
    }
    if (Quotient != (WordType *)0x0) {
      for (local_2ac = 0; local_2ac < lhsWords; local_2ac = local_2ac + 1) {
        uVar6 = Make_64(R[local_2ac * 2 + 1],R[local_2ac << 1]);
        Quotient[local_2ac] = uVar6;
      }
    }
    if (Remainder != (WordType *)0x0) {
      for (local_2b0 = 0; local_2b0 < rhsWords; local_2b0 = local_2b0 + 1) {
        uVar6 = Make_64(puStack_268[local_2b0 * 2 + 1],puStack_268[local_2b0 << 1]);
        Remainder[local_2b0] = uVar6;
      }
    }
    if ((uint32_t **)V != &U) {
      if (V != (uint32_t *)0x0) {
        operator_delete__(V);
      }
      if (Q != (uint32_t *)0x0) {
        operator_delete__(Q);
      }
      if (R != (uint32_t *)0x0) {
        operator_delete__(R);
      }
      if (puStack_268 != (uint32_t *)0x0) {
        operator_delete__(puStack_268);
      }
    }
    return;
  }
  __assert_fail("n != 0 && \"Divide by zero?\"",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                ,0x5c9,
                "static void llvm::APInt::divide(const WordType *, unsigned int, const WordType *, unsigned int, WordType *, WordType *)"
               );
}

Assistant:

void APInt::divide(const WordType *LHS, unsigned lhsWords, const WordType *RHS,
                   unsigned rhsWords, WordType *Quotient, WordType *Remainder) {
  assert(lhsWords >= rhsWords && "Fractional result");

  // First, compose the values into an array of 32-bit words instead of
  // 64-bit words. This is a necessity of both the "short division" algorithm
  // and the Knuth "classical algorithm" which requires there to be native
  // operations for +, -, and * on an m bit value with an m*2 bit result. We
  // can't use 64-bit operands here because we don't have native results of
  // 128-bits. Furthermore, casting the 64-bit values to 32-bit values won't
  // work on large-endian machines.
  unsigned n = rhsWords * 2;
  unsigned m = (lhsWords * 2) - n;

  // Allocate space for the temporary values we need either on the stack, if
  // it will fit, or on the heap if it won't.
  uint32_t SPACE[128];
  uint32_t *U = nullptr;
  uint32_t *V = nullptr;
  uint32_t *Q = nullptr;
  uint32_t *R = nullptr;
  if ((Remainder?4:3)*n+2*m+1 <= 128) {
    U = &SPACE[0];
    V = &SPACE[m+n+1];
    Q = &SPACE[(m+n+1) + n];
    if (Remainder)
      R = &SPACE[(m+n+1) + n + (m+n)];
  } else {
    U = new uint32_t[m + n + 1];
    V = new uint32_t[n];
    Q = new uint32_t[m+n];
    if (Remainder)
      R = new uint32_t[n];
  }

  // Initialize the dividend
  memset(U, 0, (m+n+1)*sizeof(uint32_t));
  for (unsigned i = 0; i < lhsWords; ++i) {
    uint64_t tmp = LHS[i];
    U[i * 2] = Lo_32(tmp);
    U[i * 2 + 1] = Hi_32(tmp);
  }
  U[m+n] = 0; // this extra word is for "spill" in the Knuth algorithm.

  // Initialize the divisor
  memset(V, 0, (n)*sizeof(uint32_t));
  for (unsigned i = 0; i < rhsWords; ++i) {
    uint64_t tmp = RHS[i];
    V[i * 2] = Lo_32(tmp);
    V[i * 2 + 1] = Hi_32(tmp);
  }

  // initialize the quotient and remainder
  memset(Q, 0, (m+n) * sizeof(uint32_t));
  if (Remainder)
    memset(R, 0, n * sizeof(uint32_t));

  // Now, adjust m and n for the Knuth division. n is the number of words in
  // the divisor. m is the number of words by which the dividend exceeds the
  // divisor (i.e. m+n is the length of the dividend). These sizes must not
  // contain any zero words or the Knuth algorithm fails.
  for (unsigned i = n; i > 0 && V[i-1] == 0; i--) {
    n--;
    m++;
  }
  for (unsigned i = m+n; i > 0 && U[i-1] == 0; i--)
    m--;

  // If we're left with only a single word for the divisor, Knuth doesn't work
  // so we implement the short division algorithm here. This is much simpler
  // and faster because we are certain that we can divide a 64-bit quantity
  // by a 32-bit quantity at hardware speed and short division is simply a
  // series of such operations. This is just like doing short division but we
  // are using base 2^32 instead of base 10.
  assert(n != 0 && "Divide by zero?");
  if (n == 1) {
    uint32_t divisor = V[0];
    uint32_t remainder = 0;
    for (int i = m; i >= 0; i--) {
      uint64_t partial_dividend = Make_64(remainder, U[i]);
      if (partial_dividend == 0) {
        Q[i] = 0;
        remainder = 0;
      } else if (partial_dividend < divisor) {
        Q[i] = 0;
        remainder = Lo_32(partial_dividend);
      } else if (partial_dividend == divisor) {
        Q[i] = 1;
        remainder = 0;
      } else {
        Q[i] = Lo_32(partial_dividend / divisor);
        remainder = Lo_32(partial_dividend - (Q[i] * divisor));
      }
    }
    if (R)
      R[0] = remainder;
  } else {
    // Now we're ready to invoke the Knuth classical divide algorithm. In this
    // case n > 1.
    KnuthDiv(U, V, Q, R, m, n);
  }

  // If the caller wants the quotient
  if (Quotient) {
    for (unsigned i = 0; i < lhsWords; ++i)
      Quotient[i] = Make_64(Q[i*2+1], Q[i*2]);
  }

  // If the caller wants the remainder
  if (Remainder) {
    for (unsigned i = 0; i < rhsWords; ++i)
      Remainder[i] = Make_64(R[i*2+1], R[i*2]);
  }

  // Clean up the memory we allocated.
  if (U != &SPACE[0]) {
    delete [] U;
    delete [] V;
    delete [] Q;
    delete [] R;
  }
}